

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O0

void duckdb::TupleDataArrayScatter
               (Vector *source,TupleDataVectorFormat *source_format,SelectionVector *append_sel,
               idx_t append_count,TupleDataLayout *layout,Vector *row_locations,
               Vector *heap_locations,idx_t col_idx,UnifiedVectorFormat *param_9,
               vector<duckdb::TupleDataScatterFunction,_true> *child_functions)

{
  SelectionVector *this;
  bool bVar1;
  const_reference pvVar2;
  idx_t idx;
  Vector *pVVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  ulong in_RCX;
  SelectionVector *in_RDX;
  long in_RSI;
  TupleDataLayout *in_R8;
  Vector *in_R9;
  Vector *in_stack_00000008;
  idx_t in_stack_00000010;
  value_type *child_function;
  value_type *child_format;
  Vector *child_source;
  uchar **target_heap_location;
  idx_t source_idx;
  idx_t i;
  value_type offset_in_row;
  idx_t idx_in_entry;
  idx_t entry_idx;
  uchar **target_heap_locations;
  uchar **target_locations;
  ValidityMask *validity;
  list_entry_t *data;
  SelectionVector *source_sel;
  UnifiedVectorFormat *source_data;
  size_type in_stack_fffffffffffffef8;
  vector<duckdb::TupleDataScatterFunction,_true> *in_stack_ffffffffffffff00;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff08;
  TemplatedValidityMask<unsigned_char> *in_stack_ffffffffffffff10;
  TemplatedValidityMask<unsigned_char> local_c0;
  uchar **local_a0;
  idx_t local_98;
  ulong local_90;
  value_type local_88;
  idx_t local_80;
  idx_t local_78;
  uchar **local_70;
  uchar **local_68;
  ValidityMask *local_60;
  list_entry_t *local_58;
  SelectionVector *local_50;
  UnifiedVectorFormat *local_48;
  Vector *local_40;
  TupleDataLayout *local_38;
  ulong local_30;
  SelectionVector *local_28;
  long local_20;
  
  local_48 = (UnifiedVectorFormat *)(in_RSI + 0x20);
  local_50 = local_48->sel;
  local_40 = in_R9;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_58 = UnifiedVectorFormat::GetData<duckdb::list_entry_t>(local_48);
  local_60 = &local_48->validity;
  local_68 = FlatVector::GetData<unsigned_char*>((Vector *)0x164d297);
  local_70 = FlatVector::GetData<unsigned_char*>((Vector *)0x164d2ac);
  TemplatedValidityMask<unsigned_char>::GetEntryIndex(in_stack_00000010,&local_78,&local_80);
  TupleDataLayout::GetOffsets(local_38);
  pvVar2 = vector<unsigned_long,_true>::operator[]
                     ((vector<unsigned_long,_true> *)in_stack_ffffffffffffff00,
                      in_stack_fffffffffffffef8);
  local_88 = *pvVar2;
  for (local_90 = 0; this = local_50, local_90 < local_30; local_90 = local_90 + 1) {
    idx = SelectionVector::get_index(local_28,local_90);
    local_98 = SelectionVector::get_index(this,idx);
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_ffffffffffffff08,(idx_t)in_stack_ffffffffffffff00);
    if (bVar1) {
      local_a0 = local_70 + local_90;
      Store<unsigned_char*>(local_a0,local_68[local_90] + local_88);
      Store<unsigned_long>(&local_58[local_98].length,*local_a0);
      *local_a0 = *local_a0 + 8;
    }
    else {
      TupleDataLayout::ColumnCount((TupleDataLayout *)0x164d3f3);
      TemplatedValidityMask<unsigned_char>::TemplatedValidityMask
                (in_stack_ffffffffffffff10,(uchar *)in_stack_ffffffffffffff08,
                 (idx_t)in_stack_ffffffffffffff00);
      TemplatedValidityMask<unsigned_char>::SetInvalidUnsafe(&local_c0,local_78,local_80);
      TemplatedValidityMask<unsigned_char>::~TemplatedValidityMask
                ((TemplatedValidityMask<unsigned_char> *)0x164d429);
    }
  }
  pVVar3 = ArrayVector::GetEntry((Vector *)0x164d44b);
  pvVar4 = vector<duckdb::TupleDataVectorFormat,_true>::operator[]
                     ((vector<duckdb::TupleDataVectorFormat,_true> *)in_stack_ffffffffffffff00,
                      in_stack_fffffffffffffef8);
  pvVar5 = vector<duckdb::TupleDataScatterFunction,_true>::operator[]
                     (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  (*pvVar5->function)(pVVar3,pvVar4,local_28,local_30,local_38,local_40,in_stack_00000008,
                      in_stack_00000010,(UnifiedVectorFormat *)(local_20 + 0x20),
                      &pvVar5->child_functions);
  return;
}

Assistant:

static void TupleDataArrayScatter(const Vector &source, const TupleDataVectorFormat &source_format,
                                  const SelectionVector &append_sel, const idx_t append_count,
                                  const TupleDataLayout &layout, const Vector &row_locations, Vector &heap_locations,
                                  const idx_t col_idx, const UnifiedVectorFormat &,
                                  const vector<TupleDataScatterFunction> &child_functions) {
	// Source
	// The Array vector has fake list_entry_t's set by this point, so this is fine
	const auto &source_data = source_format.unified;
	const auto &source_sel = *source_data.sel;
	const auto data = UnifiedVectorFormat::GetData<list_entry_t>(source_data);
	const auto &validity = source_data.validity;

	// Target
	const auto target_locations = FlatVector::GetData<data_ptr_t>(row_locations);
	const auto target_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	// Precompute mask indexes
	idx_t entry_idx;
	idx_t idx_in_entry;
	ValidityBytes::GetEntryIndex(col_idx, entry_idx, idx_in_entry);

	// Set validity of the LIST in this layout, and store pointer to where it's stored
	const auto offset_in_row = layout.GetOffsets()[col_idx];
	for (idx_t i = 0; i < append_count; i++) {
		const auto source_idx = source_sel.get_index(append_sel.get_index(i));
		if (validity.RowIsValid(source_idx)) {
			auto &target_heap_location = target_heap_locations[i];
			Store<data_ptr_t>(target_heap_location, target_locations[i] + offset_in_row);

			// Store list length and skip over it
			Store<uint64_t>(data[source_idx].length, target_heap_location);
			target_heap_location += sizeof(uint64_t);
		} else {
			ValidityBytes(target_locations[i], layout.ColumnCount()).SetInvalidUnsafe(entry_idx, idx_in_entry);
		}
	}

	// Recurse
	D_ASSERT(child_functions.size() == 1);
	auto &child_source = ArrayVector::GetEntry(source);
	auto &child_format = source_format.children[0];
	const auto &child_function = child_functions[0];
	child_function.function(child_source, child_format, append_sel, append_count, layout, row_locations, heap_locations,
	                        col_idx, source_format.unified, child_function.child_functions);
}